

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
          (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,cbor_decode_options *options
          ,allocator<char> *alloc)

{
  pointer puVar1;
  int local_38 [2];
  
  *(undefined ***)this = &PTR__basic_cbor_parser_00999ec8;
  *(undefined2 *)(this + 8) = 1;
  this[10] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0xc) = 0;
  *(undefined8 *)(this + 0x14) = 0;
  puVar1 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x30) = puVar1;
  *(pointer *)(this + 0x38) = puVar1;
  *(pointer *)(this + 0x40) =
       (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  *(undefined4 *)(this + 0x58) =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_cbor_decode_options[-3]);
  *(undefined8 *)(this + 0x48) = 0x999f30;
  *(undefined8 *)(this + 0x50) = 0x999f58;
  *(basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> **)(this + 0x60) = this + 0x70;
  *(undefined8 *)(this + 0x68) = 0;
  this[0x70] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>
            ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>> *)
             (this + 0x98),(parse_mode *)(local_38 + 1),local_38);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }